

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O2

void __thiscall lsim::StringProperty::StringProperty(StringProperty *this,char *key,char *value)

{
  allocator local_11;
  
  Property::Property(&this->super_Property,key);
  (this->super_Property)._vptr_Property = (_func_int **)&PTR__StringProperty_001c37b0;
  std::__cxx11::string::string((string *)&this->m_value,value,&local_11);
  return;
}

Assistant:

StringProperty::StringProperty(const char *key, const char *value) : 
    Property(key),
    m_value(value) {
}